

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDShuffle(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  Expression *right;
  SIMDShuffle *pSVar2;
  size_t i;
  long lVar3;
  undefined1 local_48 [8];
  array<unsigned_char,_16UL> mask;
  
  mask._M_elems._8_8_ = make(this,(Type)0x6);
  right = make(this,(Type)0x6);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    uVar1 = Random::upTo(&this->random,0x20);
    local_48[lVar3] = (char)uVar1;
  }
  pSVar2 = Builder::makeSIMDShuffle
                     (&this->builder,(Expression *)mask._M_elems._8_8_,right,
                      (array<unsigned_char,_16UL> *)local_48);
  return (Expression *)pSVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDShuffle() {
  Expression* left = make(Type::v128);
  Expression* right = make(Type::v128);
  std::array<uint8_t, 16> mask;
  for (size_t i = 0; i < 16; ++i) {
    mask[i] = upTo(32);
  }
  return builder.makeSIMDShuffle(left, right, mask);
}